

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_map_delete(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue key_00;
  JSValue JVar1;
  void *pvVar2;
  JSRuntime *rt;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  JSValue key;
  JSMapRecord *mr;
  JSMapState *s;
  undefined8 local_70;
  JSContext *ctx_00;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSValueUnion in_stack_ffffffffffffffb0;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  JVar3.tag = (int64_t)in_stack_ffffffffffffffb0.ptr;
  JVar3.u.float64 = in_stack_ffffffffffffffa8.float64;
  pvVar2 = JS_GetOpaque2(in_stack_ffffffffffffffa0,JVar3,local_70._12_4_);
  if (pvVar2 == (void *)0x0) {
    local_10 = 0;
    local_8 = 6;
  }
  else {
    JVar3 = map_normalize_key(in_RDI,*in_R8);
    local_70 = JVar3.u;
    ctx_00 = (JSContext *)JVar3.tag;
    key_00.tag = (int64_t)pvVar2;
    key_00.u.ptr = in_stack_ffffffffffffffb0.ptr;
    rt = (JSRuntime *)map_find_record(ctx_00,(JSMapState *)local_70,key_00);
    if (rt == (JSRuntime *)0x0) {
      local_10 = 0;
      local_8 = 1;
    }
    else {
      map_delete_record(rt,(JSMapState *)ctx_00,(JSMapRecord *)local_70);
      local_10 = 1;
      local_8 = 1;
    }
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_map_delete(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    mr = map_find_record(ctx, s, key);
    if (!mr)
        return JS_FALSE;
    map_delete_record(ctx->rt, s, mr);
    return JS_TRUE;
}